

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread_test.c
# Opt level: O2

void mutex_performance_test_once(void)

{
  pthread_mutexattr_t attr;
  pthread_mutex_t mutex;
  
  pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
  pthread_mutex_init((pthread_mutex_t *)&mutex,(pthread_mutexattr_t *)&attr);
  pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  pthread_mutex_destroy((pthread_mutex_t *)&mutex);
  return;
}

Assistant:

void mutex_performance_test_once(void)
{
    pthread_mutexattr_t attr;
    pthread_mutex_t mutex;

    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);

    pthread_mutex_init(&mutex, &attr);
    pthread_mutexattr_destroy(&attr);

    pthread_mutex_lock(&mutex);
    pthread_mutex_unlock(&mutex);

    pthread_mutex_lock(&mutex);
    pthread_mutex_unlock(&mutex);

    pthread_mutex_lock(&mutex);
    pthread_mutex_unlock(&mutex);

    pthread_mutex_lock(&mutex);
    pthread_mutex_unlock(&mutex);

    pthread_mutex_destroy(&mutex);
}